

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3DeferredToken *pFVar1;
  Fts3Expr *pFVar2;
  int iVar3;
  char *__dest;
  char *pcVar4;
  Fts3Expr *pFVar5;
  Fts3Phrase *pFVar6;
  int iVar7;
  long lVar8;
  Fts3Expr *pFVar9;
  Fts3DeferredToken **ppFVar10;
  uint uVar11;
  uint uVar12;
  size_t __n;
  Fts3Expr *p;
  bool bVar13;
  char *aPoslist;
  char *p1;
  char *p2;
  char *local_70;
  int *local_68;
  Fts3Cursor *local_60;
  char *local_58;
  Fts3Phrase *local_50;
  char *local_48;
  Fts3Expr *local_40;
  uint local_34;
  
  if (*pRc != 0) {
    return 1;
  }
  switch(pExpr->eType) {
  case 1:
  case 3:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if ((iVar3 != 0) && (iVar3 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc), iVar3 != 0)) {
      if (*pRc != 0) {
        return 1;
      }
      if (pExpr->eType != 1) {
        return 1;
      }
      if ((pExpr->pParent != (Fts3Expr *)0x0) && (pExpr->pParent->eType == 1)) {
        return 1;
      }
      lVar8 = 0;
      pFVar5 = pExpr->pLeft;
      pFVar9 = pExpr;
      while (pFVar2 = pFVar5, pFVar2 != (Fts3Expr *)0x0) {
        lVar8 = lVar8 + (pFVar9->pRight->pPhrase->doclist).nList;
        pFVar9 = pFVar2;
        pFVar5 = pFVar2->pLeft;
      }
      iVar3 = (pFVar9->pPhrase->doclist).nList;
      local_60 = pCsr;
      iVar7 = sqlite3_initialize();
      if ((iVar7 == 0) &&
         (pcVar4 = (char *)sqlite3Malloc((lVar8 + iVar3) * 2), pcVar4 != (char *)0x0)) {
        local_70 = (pFVar9->pPhrase->doclist).pList;
        local_58 = (char *)CONCAT44(local_58._4_4_,pFVar9->pPhrase->nToken);
        pFVar9 = pFVar9->pParent;
        if (pFVar9 == (Fts3Expr *)0x0) {
LAB_001c0991:
          iVar3 = 1;
        }
        else {
          do {
            if (pFVar9->eType != 1) goto LAB_001c0991;
            iVar3 = fts3EvalNearTrim(pFVar9->nNear,pcVar4,&local_70,(int *)&local_58,
                                     pFVar9->pRight->pPhrase);
          } while ((iVar3 != 0) && (pFVar9 = pFVar9->pParent, pFVar9 != (Fts3Expr *)0x0));
        }
        pFVar6 = pExpr->pRight->pPhrase;
        local_70 = (pFVar6->doclist).pList;
        local_58 = (char *)CONCAT44(local_58._4_4_,pFVar6->nToken);
        pFVar9 = pExpr->pLeft;
        if (iVar3 != 0 && pFVar9 != (Fts3Expr *)0x0) {
          do {
            pFVar5 = pFVar9;
            if (pFVar9->eType == 1) {
              pFVar5 = pFVar9->pRight;
            }
            iVar3 = fts3EvalNearTrim(pFVar9->pParent->nNear,pcVar4,&local_70,(int *)&local_58,
                                     pFVar5->pPhrase);
            pFVar9 = pFVar9->pLeft;
          } while ((pFVar9 != (Fts3Expr *)0x0) && (iVar3 != 0));
        }
        sqlite3_free(pcVar4);
        pCsr = local_60;
        if (iVar3 != 0) {
          return 1;
        }
      }
      else {
        *pRc = 7;
        pCsr = local_60;
      }
    }
    if (pExpr->eType != 1) {
      return 0;
    }
    if ((pExpr->pParent != (Fts3Expr *)0x0) && (pExpr->pParent->eType == 1)) {
      return 0;
    }
    pFVar6 = pExpr->pPhrase;
    while (pFVar6 == (Fts3Phrase *)0x0) {
      if (pExpr->pRight->iDocid == pCsr->iPrevId) {
        pFVar6 = pExpr->pRight->pPhrase;
        if ((pFVar6->doclist).bFreeList != 0) {
          sqlite3_free((pFVar6->doclist).pList);
        }
        (pFVar6->doclist).pList = (char *)0x0;
        (pFVar6->doclist).nList = 0;
        (pFVar6->doclist).bFreeList = 0;
      }
      pExpr = pExpr->pLeft;
      pFVar6 = pExpr->pPhrase;
    }
    if (pExpr->iDocid != pCsr->iPrevId) {
      return 0;
    }
    if ((pFVar6->doclist).bFreeList != 0) {
      sqlite3_free((pFVar6->doclist).pList);
    }
    (pFVar6->doclist).pList = (char *)0x0;
    (pFVar6->doclist).nList = 0;
    (pFVar6->doclist).bFreeList = 0;
    return 0;
  case 2:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    bVar13 = iVar3 == 0;
    goto LAB_001c07b9;
  case 4:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar7 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    return (uint)(iVar7 != 0 || iVar3 != 0);
  }
  if (pCsr->pDeferred == (Fts3DeferredToken *)0x0) {
LAB_001c07a5:
    if (pExpr->bEof != '\0') {
      return 0;
    }
    bVar13 = pExpr->iDocid == pCsr->iPrevId;
LAB_001c07b9:
    return (uint)bVar13;
  }
  if (pExpr->iDocid == pCsr->iPrevId) {
    local_50 = pExpr->pPhrase;
    pFVar6 = local_50;
    if (pExpr->bDeferred != '\0') goto LAB_001c05db;
  }
  else {
    if (pExpr->bDeferred == '\0') goto LAB_001c07a5;
    pFVar6 = pExpr->pPhrase;
LAB_001c05db:
    if ((pFVar6->doclist).bFreeList != 0) {
      sqlite3_free((pFVar6->doclist).pList);
    }
    (pFVar6->doclist).pList = (char *)0x0;
    (pFVar6->doclist).nList = 0;
    (pFVar6->doclist).bFreeList = 0;
    local_50 = pFVar6;
  }
  local_68 = pRc;
  if (local_50->nToken < 1) {
    iVar3 = 0;
  }
  else {
    ppFVar10 = &local_50->aToken[0].pDeferred;
    uVar11 = 0xffffffff;
    lVar8 = 0;
    __n = 0;
    pFVar6 = local_50;
    pcVar4 = (char *)0x0;
    local_60 = pCsr;
    local_40 = pExpr;
    do {
      pFVar1 = *ppFVar10;
      __dest = pcVar4;
      if (pFVar1 != (Fts3DeferredToken *)0x0) {
        if (pFVar1->pList == (PendingList *)0x0) {
          sqlite3_free(pcVar4);
          (local_50->doclist).pList = (char *)0x0;
          (local_50->doclist).nList = 0;
          pFVar6 = local_50;
          goto LAB_001c0a3b;
        }
        local_34 = uVar11;
        __dest = (char *)sqlite3_malloc(pFVar1->pList->nData);
        if (__dest == (char *)0x0) {
          iVar3 = 7;
          pCsr = local_60;
          pExpr = local_40;
          goto LAB_001c0a40;
        }
        iVar3 = sqlite3Fts3GetVarint(pFVar1->pList->aData,(sqlite_int64 *)&local_70);
        __n = (long)pFVar1->pList->nData - (long)iVar3;
        memcpy(__dest,pFVar1->pList->aData + iVar3,__n);
        uVar11 = (uint)lVar8;
        pFVar6 = local_50;
        pCsr = local_60;
        pExpr = local_40;
        if (pcVar4 != (char *)0x0) {
          local_70 = __dest;
          local_58 = pcVar4;
          local_48 = __dest;
          fts3PoslistPhraseMerge(&local_70,uVar11 - local_34,0,1,&local_58,&local_48);
          sqlite3_free(pcVar4);
          uVar12 = (int)local_70 - (int)__dest;
          __n = (size_t)uVar12;
          pFVar6 = local_50;
          pCsr = local_60;
          pExpr = local_40;
          if (uVar12 == 0) {
            sqlite3_free(__dest);
            (local_50->doclist).pList = (char *)0x0;
            (local_50->doclist).nList = 0;
            iVar3 = 0;
            pCsr = local_60;
            pExpr = local_40;
            goto LAB_001c0a40;
          }
        }
      }
      lVar8 = lVar8 + 1;
      ppFVar10 = ppFVar10 + 5;
      pcVar4 = __dest;
    } while (lVar8 < pFVar6->nToken);
    if (-1 < (int)uVar11) {
      uVar12 = pFVar6->iDoclistToken;
      if ((int)uVar12 < 0) {
        (pFVar6->doclist).pList = __dest;
        (pFVar6->doclist).nList = (int)__n;
        (pFVar6->doclist).iDocid = pCsr->iPrevId;
        (pFVar6->doclist).bFreeList = 1;
      }
      else {
        pcVar4 = (pFVar6->doclist).pList;
        local_58 = pcVar4;
        local_70 = __dest;
        if (uVar12 <= uVar11) {
          local_58 = __dest;
          local_70 = pcVar4;
        }
        local_48 = (char *)sqlite3_malloc((int)__n + 8);
        if (local_48 == (char *)0x0) {
          sqlite3_free(__dest);
          iVar3 = 7;
          local_50 = pFVar6;
          goto LAB_001c0a40;
        }
        iVar3 = uVar11 - uVar12;
        if (uVar11 < uVar12) {
          iVar3 = -(uVar11 - uVar12);
        }
        (pFVar6->doclist).pList = local_48;
        iVar7 = 0;
        iVar3 = fts3PoslistPhraseMerge(&local_48,iVar3,0,1,&local_70,&local_58);
        if (iVar3 == 0) {
          sqlite3_free(local_48);
          (pFVar6->doclist).pList = (char *)0x0;
        }
        else {
          (pFVar6->doclist).bFreeList = 1;
          iVar7 = (int)local_48 - *(int *)&(pFVar6->doclist).pList;
        }
        (pFVar6->doclist).nList = iVar7;
        sqlite3_free(__dest);
        pFVar6 = local_50;
      }
    }
LAB_001c0a3b:
    iVar3 = 0;
    local_50 = pFVar6;
  }
LAB_001c0a40:
  *local_68 = iVar3;
  pcVar4 = (local_50->doclist).pList;
  pExpr->iDocid = pCsr->iPrevId;
  return (uint)(pcVar4 != (char *)0x0);
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for 
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize 
        ** any instances of phrases that are part of unmatched NEAR queries. 
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0 
         && pExpr->eType==FTSQUERY_NEAR 
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred 
         && (pExpr->iDocid==pCsr->iPrevId || pExpr->bDeferred)
        ){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          assert( pExpr->bDeferred || pPhrase->doclist.bFreeList==0 );
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId);
        }
        break;
      }
    }
  }
  return bHit;
}